

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_writer.cpp
# Opt level: O3

data_ptr_t __thiscall duckdb::MetadataWriter::BasePtr(MetadataWriter *this)

{
  byte bVar1;
  data_ptr_t pdVar2;
  BlockManager *pBVar3;
  idx_t iVar4;
  idx_t iVar5;
  
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->block).handle.node);
  pdVar2 = ((this->block).handle.node.ptr)->buffer;
  bVar1 = (this->current_pointer).field_0x7;
  pBVar3 = this->manager->block_manager;
  iVar4 = optional_idx::GetIndex(&pBVar3->block_alloc_size);
  iVar5 = optional_idx::GetIndex(&pBVar3->block_header_size);
  return pdVar2 + (iVar4 - iVar5 >> 6 & 0xfffffffffffffff8) * (ulong)bVar1;
}

Assistant:

data_ptr_t MetadataWriter::BasePtr() {
	return block.handle.Ptr() + current_pointer.index * GetManager().GetMetadataBlockSize();
}